

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  undefined1 *puVar1;
  urlpieces *puVar2;
  char **ppcVar3;
  byte bVar4;
  ushort uVar5;
  Curl_handler *pCVar6;
  curl_trc_feat *pcVar7;
  undefined4 uVar8;
  _Bool _Var9;
  uint uVar10;
  CURLUcode CVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  int iVar14;
  connectdata *conn;
  char *pcVar16;
  CURLU *u;
  size_t sVar17;
  size_t sVar18;
  stsentry *psVar19;
  char *pcVar20;
  long lVar21;
  CURLcode CVar22;
  ulong uVar23;
  ConnectBits CVar24;
  ulong uVar25;
  char *pcVar26;
  connectdata *conn_00;
  char *pcVar27;
  curl_proxytype proxytype;
  bool bVar28;
  curltime cVar29;
  _Bool waitpipe;
  _Bool force_reuse;
  char *newurl;
  connectdata *existing;
  _Bool local_81;
  _Bool *local_80;
  _Bool local_71;
  _Bool *local_70;
  char *local_68 [3];
  hsts *local_50;
  urlpieces *local_48;
  connectdata *local_40;
  char *local_38;
  ulong uVar15;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  local_40 = (connectdata *)0x0;
  local_71 = false;
  local_81 = false;
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    CVar13 = CURLE_URL_MALFORMAT;
    conn_00 = (connectdata *)0x0;
    goto LAB_00162e7e;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x578);
  if (conn == (connectdata *)0x0) {
LAB_001625e5:
    conn = (connectdata *)0x0;
  }
  else {
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->sockfd = -1;
    conn->writesockfd = -1;
    conn->connection_id = -1;
    (conn->primary).remote_port = -1;
    conn->remote_port = -1;
    Curl_conncontrol(conn,1);
    cVar29 = Curl_now();
    (conn->created).tv_sec = cVar29.tv_sec;
    (conn->created).tv_usec = cVar29.tv_usec;
    (conn->keepalive).tv_sec = (conn->created).tv_sec;
    (conn->keepalive).tv_usec = (conn->created).tv_usec;
    *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
    bVar4 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar4;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar16 = (data->set).str[0x26];
    uVar10 = 0;
    if (pcVar16 != (char *)0x0) {
      uVar10 = (uint)(*pcVar16 != '\0') << 4;
    }
    uVar15 = (ulong)uVar10;
    CVar24 = conn->bits;
    conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffffffef | uVar15);
    if (uVar15 == 0) {
      uVar25 = 0;
    }
    else {
      uVar25 = 1;
      if (2 < bVar4) {
        uVar25 = (ulong)(bVar4 == 3);
      }
    }
    uVar23 = (ulong)(uint)((int)uVar25 * 2) ^ 2;
    if (uVar15 == 0) {
      uVar23 = 0;
    }
    CVar24 = (ConnectBits)(uVar23 | uVar25 | (ulong)CVar24 & 0xffffffffffffffec | uVar15);
    conn->bits = CVar24;
    pcVar16 = (data->set).str[0x27];
    if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
      conn->bits = (ConnectBits)((ulong)CVar24 | 0x12);
    }
    CVar24 = (ConnectBits)
             (((ulong)conn->bits & 0xfffffffffffffffb) +
             (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
    conn->bits = CVar24;
    uVar15 = (ulong)(*(uint *)&(data->set).field_0x894 >> 8 & 8);
    conn->bits = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffff7 | uVar15);
    uVar25 = (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x8000);
    conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffff7ff7 | uVar15 | uVar25);
    conn->bits = (ConnectBits)
                 ((ulong)CVar24 & 0xfffffffffffe7ff7 | uVar15 | uVar25 |
                 (ulong)(*(uint *)&(data->set).field_0x894 >> 1 & 0x10000));
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).field_0x894 & 1;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar16 = (data->set).str[0x1e];
    if (pcVar16 != (char *)0x0) {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      conn->localdev = pcVar16;
      if (pcVar16 == (char *)0x0) {
        (*Curl_cfree)((void *)0x0);
        (*Curl_cfree)(conn);
        goto LAB_001625e5;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = (data->set).closesocket_client;
    iVar14 = (conn->created).tv_usec;
    uVar8 = *(undefined4 *)&(conn->created).field_0xc;
    (conn->lastused).tv_sec = (conn->created).tv_sec;
    (conn->lastused).tv_usec = iVar14;
    *(undefined4 *)&(conn->lastused).field_0xc = uVar8;
  }
  if (conn == (connectdata *)0x0) {
    CVar13 = CURLE_OUT_OF_MEMORY;
    conn_00 = (connectdata *)0x0;
    goto LAB_00162e7e;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    bVar28 = false;
  }
  else {
    bVar28 = ((data->state).field_0x7be & 8) == 0;
  }
  local_80 = asyncp;
  local_70 = protocol_done;
  up_free(data);
  if (bVar28) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar13 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_00162ab5_caseD_6;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar17 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar17 == 0)) {
    pcVar16 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar16 == (char *)0x0) goto switchD_00162ab5_caseD_6;
    if (((data->state).field_0x7c0 & 1) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = pcVar16;
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 | 1;
  }
  CVar22 = CURLE_OUT_OF_MEMORY;
  if (bVar28) goto LAB_001627d0;
  uVar10 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x894 >> 0x20);
  CVar11 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                        (uVar10 >> 0xc & 0x20) + (uVar10 >> 7 & 0x10) + 0x208);
  if (CVar11 != CURLUE_OK) {
    pcVar16 = curl_url_strerror(CVar11);
    bVar28 = false;
    Curl_failf(data,"URL rejected: %s",pcVar16);
    if (CVar11 == CURLUE_USER_NOT_ALLOWED) {
switchD_00162776_caseD_8:
      CVar22 = CURLE_LOGIN_DENIED;
      goto LAB_001627c1;
    }
    if (CVar11 == CURLUE_OUT_OF_MEMORY) goto switchD_00162776_caseD_7;
    CVar22 = CURLE_URL_MALFORMAT;
    if (CVar11 == CURLUE_UNSUPPORTED_SCHEME) goto switchD_00162776_caseD_5;
    goto switchD_00162776_caseD_1;
  }
  bVar28 = false;
  CVar11 = curl_url_get(u,CURLUPART_URL,local_68,0);
  CVar22 = CURLE_URL_MALFORMAT;
  switch(CVar11) {
  case CURLUE_OK:
    if (((data->state).field_0x7c0 & 1) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = local_68[0];
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 | 1;
    CVar22 = CURLE_OUT_OF_MEMORY;
    bVar28 = true;
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_00162776_caseD_5:
    CVar22 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_001627c1;
  case CURLUE_OUT_OF_MEMORY:
switchD_00162776_caseD_7:
    CVar22 = CURLE_OUT_OF_MEMORY;
LAB_001627c1:
    bVar28 = false;
    break;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_00162776_caseD_8;
  }
switchD_00162776_caseD_1:
  CVar13 = CVar22;
  if (!bVar28) goto switchD_00162ab5_caseD_6;
LAB_001627d0:
  puVar2 = &(data->state).up;
  CVar11 = curl_url_get(u,CURLUPART_SCHEME,&puVar2->scheme,0);
  switch(CVar11) {
  case CURLUE_OK:
    ppcVar3 = &(data->state).up.hostname;
    CVar11 = curl_url_get(u,CURLUPART_HOST,ppcVar3,0);
    if (CVar11 == CURLUE_OK) {
      sVar18 = strlen(*ppcVar3);
      if (sVar18 < 0x10000) goto LAB_00162868;
      Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
      goto switchD_00162800_caseD_1;
    }
    iVar14 = curl_strequal("file",puVar2->scheme);
    if (iVar14 == 0) goto switchD_00162800_caseD_7;
LAB_00162868:
    pcVar16 = *ppcVar3;
    local_48 = puVar2;
    if (pcVar16 == (char *)0x0) {
      pcVar26 = (char *)0x0;
    }
    else {
      pcVar26 = pcVar16;
      if (*pcVar16 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 4;
        pcVar26 = pcVar16 + 1;
        sVar18 = strlen(pcVar26);
        pcVar16[sVar18] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    pcVar16 = "";
    if (pcVar26 != (char *)0x0) {
      pcVar16 = pcVar26;
    }
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    (conn->host).rawalloc = pcVar16;
    if (pcVar16 == (char *)0x0) goto switchD_00162800_caseD_7;
    (conn->host).name = pcVar16;
    CVar13 = Curl_idnconvert_hostname(&conn->host);
    puVar2 = local_48;
    if (CVar13 != CURLE_OK) break;
    if ((data->hsts != (hsts *)0x0) &&
       (iVar14 = curl_strequal("http",local_48->scheme), iVar14 != 0)) {
      local_50 = data->hsts;
      pcVar16 = (conn->host).name;
      sVar18 = strlen(pcVar16);
      psVar19 = Curl_hsts(local_50,pcVar16,sVar18,true);
      if (psVar19 == (stsentry *)0x0) goto LAB_00162a40;
      (*Curl_cfree)(puVar2->scheme);
      puVar2->scheme = (char *)0x0;
      CVar11 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      switch(CVar11) {
      case CURLUE_OK:
        if (((data->state).field_0x7c0 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar11 = curl_url_get(u,CURLUPART_URL,local_68,0);
        switch(CVar11) {
        case CURLUE_OK:
          CVar11 = curl_url_get(u,CURLUPART_SCHEME,&local_48->scheme,0);
          if (CVar11 == CURLUE_OK) {
            (data->state).url = local_68[0];
            puVar1 = &(data->state).field_0x7c0;
            *puVar1 = *puVar1 | 1;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
            }
            bVar28 = true;
            CVar13 = CVar22;
          }
          else {
            (*Curl_cfree)(local_68[0]);
            if (CVar11 == CURLUE_USER_NOT_ALLOWED) goto switchD_00162994_caseD_8;
            if (CVar11 == CURLUE_OUT_OF_MEMORY) goto switchD_00162994_caseD_7;
            if (CVar11 == CURLUE_UNSUPPORTED_SCHEME) goto switchD_00162994_caseD_5;
            bVar28 = false;
            CVar13 = CURLE_URL_MALFORMAT;
          }
          break;
        default:
          goto switchD_00162994_caseD_1;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_00162994_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_00162994_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_00162994_caseD_8;
        }
        goto LAB_00162a35;
      default:
switchD_00162994_caseD_1:
        CVar13 = CURLE_URL_MALFORMAT;
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00162994_caseD_5:
        CVar13 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_00162994_caseD_7:
        CVar13 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00162994_caseD_8:
        CVar13 = CURLE_LOGIN_DENIED;
      }
      bVar28 = false;
LAB_00162a35:
      CVar22 = CVar13;
      if (!bVar28) break;
    }
LAB_00162a40:
    CVar13 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar13 != CURLE_OK) break;
    if (((data->state).aptr.passwd == (char *)0x0) ||
       (CVar12 = CURLE_OK, (*(uint *)&(data->state).field_0x7be & 3) != 2)) {
      ppcVar3 = &(data->state).up.password;
      CVar13 = CURLE_URL_MALFORMAT;
      CVar11 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar3,0);
      CVar12 = CURLE_OK;
      switch(CVar11) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00162800_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00162800_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00162800_caseD_8;
      case CURLUE_NO_PASSWORD:
        goto switchD_00162ab5_caseD_c;
      default:
        if (CVar11 == CURLUE_OK) {
          CVar13 = Curl_urldecode(*ppcVar3,0,local_68,(size_t *)0x0,
                                  ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
          if (CVar13 == CURLE_OK) {
            conn->passwd = local_68[0];
            CVar13 = Curl_setstropt(&(data->state).aptr.passwd,local_68[0]);
            CVar12 = CURLE_OK;
            if (CVar13 != CURLE_OK) goto LAB_00162b1a;
            *(uint *)&(data->state).field_0x7be =
                 (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
            bVar28 = true;
            CVar13 = CVar22;
          }
          else {
LAB_00162b1a:
            bVar28 = false;
            CVar12 = CVar13;
          }
          CVar22 = CVar13;
          if (bVar28) goto switchD_00162ab5_caseD_c;
        }
      }
      break;
    }
switchD_00162ab5_caseD_c:
    if (((data->state).aptr.user == (char *)0x0) || ((*(uint *)&(data->state).field_0x7be & 3) != 2)
       ) {
      ppcVar3 = &(data->state).up.user;
      CVar11 = curl_url_get(u,CURLUPART_USER,ppcVar3,0);
      switch(CVar11) {
      case CURLUE_OK:
        CVar12 = Curl_urldecode(*ppcVar3,0,local_68,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        local_50 = (hsts *)CONCAT44(local_50._4_4_,CVar12);
        CVar13 = CVar12;
        if (CVar12 == CURLE_OK) {
          conn->user = local_68[0];
          CVar12 = Curl_setstropt(&(data->state).aptr.user,local_68[0]);
          *(uint *)&(data->state).field_0x7be =
               (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
          CVar13 = CVar22;
        }
        if ((int)local_50 != 0) goto switchD_00162ab5_caseD_6;
        break;
      default:
        goto switchD_00162800_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00162800_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00162800_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00162800_caseD_8;
      case CURLUE_NO_USER:
        break;
      }
      CVar13 = CVar12;
      if (CVar13 != CURLE_OK) break;
    }
    ppcVar3 = &(data->state).up.options;
    CVar11 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar3,0x40);
    switch(CVar11) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00162800_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
switchD_00162800_caseD_7:
      CVar13 = CURLE_OUT_OF_MEMORY;
      break;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00162800_caseD_8;
    case CURLUE_NO_OPTIONS:
switchD_00162b7b_caseD_d:
      CVar11 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
      CVar13 = CURLE_URL_MALFORMAT;
      switch(CVar11) {
      case CURLUE_OK:
        ppcVar3 = &(data->state).up.port;
        CVar11 = curl_url_get(u,CURLUPART_PORT,ppcVar3,1);
        if (CVar11 == CURLUE_OK) {
          pcVar16 = (char *)(ulong)(data->set).use_port;
          if ((pcVar16 == (char *)0x0) || (((data->state).field_0x7be & 0x40) == 0)) {
            local_38 = *ppcVar3;
            iVar14 = Curl_str_number(&local_38,(curl_off_t *)local_68,0xffff);
            pcVar16 = local_68[0];
            if (iVar14 != 0) goto LAB_00163ac0;
          }
          local_68[0] = pcVar16;
          conn->remote_port = (uint)(ushort)local_68[0];
          (conn->primary).remote_port = (uint)(ushort)local_68[0];
        }
        else {
          iVar14 = curl_strequal("file",local_48->scheme);
          CVar13 = CURLE_OUT_OF_MEMORY;
          if (iVar14 == 0) break;
        }
LAB_00163ac0:
        CVar13 = CURLE_OK;
        curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
        uVar10 = (data->set).scope_id;
        if (uVar10 != 0) {
          conn->scope_id = uVar10;
        }
        break;
      case CURLUE_BAD_HANDLE:
      case CURLUE_BAD_PARTPOINTER:
      case CURLUE_MALFORMED_INPUT:
      case CURLUE_BAD_PORT_NUMBER:
      case CURLUE_URLDECODE:
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00162800_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00162800_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00162800_caseD_8;
      default:
        goto switchD_00162800_caseD_1;
      }
      break;
    default:
      if (CVar11 == CURLUE_OK) {
        pcVar16 = (*Curl_cstrdup)(*ppcVar3);
        conn->options = pcVar16;
        if (pcVar16 != (char *)0x0) goto switchD_00162b7b_caseD_d;
        goto switchD_00162800_caseD_7;
      }
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
switchD_00162800_caseD_1:
      CVar13 = CURLE_URL_MALFORMAT;
    }
    break;
  default:
    goto switchD_00162800_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_00162800_caseD_5:
    CVar13 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_00162800_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_00162800_caseD_8:
    CVar13 = CURLE_LOGIN_DENIED;
  }
switchD_00162ab5_caseD_6:
  protocol_done = local_70;
  asyncp = local_80;
  conn_00 = conn;
  if (CVar13 != CURLE_OK) goto LAB_00162e7e;
  pcVar16 = (data->set).str[0x42];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->sasl_authzid = pcVar16;
    if (pcVar16 != (char *)0x0) goto LAB_00162d34;
LAB_00162e78:
    CVar13 = CURLE_OUT_OF_MEMORY;
    goto LAB_00162e7e;
  }
LAB_00162d34:
  pcVar16 = (data->set).str[0x3c];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->oauth_bearer = pcVar16;
    if (pcVar16 == (char *)0x0) goto LAB_00162e78;
  }
  pcVar16 = (data->set).str[0x3d];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->unix_domain_socket = pcVar16;
    if (pcVar16 == (char *)0x0) goto LAB_00162e78;
    conn->bits = (ConnectBits)
                 ((ulong)conn->bits & 0xfffffffffbffffff |
                 (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x16) & 0x4000000));
  }
  if (((ulong)conn->bits & 4) == 0) {
LAB_00162e34:
    pcVar16 = (data->set).str[0x26];
    if (pcVar16 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      if (pcVar16 == (char *)0x0) {
        Curl_failf(data,"memory shortage");
        CVar13 = CURLE_OUT_OF_MEMORY;
        goto LAB_00162f32;
      }
    }
    pcVar26 = (data->set).str[0x27];
    if (pcVar26 == (char *)0x0) {
      pcVar26 = (char *)0x0;
    }
    else {
      pcVar26 = (*Curl_cstrdup)(pcVar26);
      if (pcVar26 == (char *)0x0) {
        pcVar26 = (char *)0x0;
        Curl_failf(data,"memory shortage");
        CVar13 = CURLE_OUT_OF_MEMORY;
        goto LAB_001633b6;
      }
    }
    if ((data->set).str[0x32] == (char *)0x0) {
      pcVar27 = "no_proxy";
      pcVar20 = curl_getenv("no_proxy");
      if (pcVar20 == (char *)0x0) {
        pcVar27 = "NO_PROXY";
        pcVar20 = curl_getenv("NO_PROXY");
      }
      if (((data != (Curl_easy *)0x0 && pcVar20 != (char *)0x0) &&
          (((data->set).field_0x897 & 0x40) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar27,pcVar20);
      }
    }
    else {
      pcVar20 = (char *)0x0;
    }
    pcVar27 = (data->set).str[0x32];
    if (pcVar27 == (char *)0x0) {
      pcVar27 = pcVar20;
    }
    _Var9 = Curl_check_noproxy((conn->host).name,pcVar27);
    if (_Var9) {
      (*Curl_cfree)(pcVar16);
      (*Curl_cfree)(pcVar26);
      pcVar16 = (char *)0x0;
LAB_00162fea:
      pcVar26 = (char *)0x0;
    }
    else if (pcVar16 == (char *)0x0 && pcVar26 == (char *)0x0) {
      pcVar26 = (char *)local_68;
      curl_msnprintf(pcVar26,0x14,"%s_proxy",conn->handler->scheme);
      pcVar16 = curl_getenv(pcVar26);
      if (pcVar16 == (char *)0x0) {
        iVar14 = curl_strequal("http_proxy",(char *)local_68);
        if (iVar14 == 0) {
          Curl_strntoupper((char *)local_68,(char *)local_68,0x14);
          pcVar16 = curl_getenv((char *)local_68);
        }
        else {
          pcVar16 = (char *)0x0;
        }
      }
      if (pcVar16 == (char *)0x0) {
        pcVar26 = (char *)local_68;
        iVar14 = curl_strequal("ws_proxy",pcVar26);
        if (iVar14 == 0) {
          iVar14 = curl_strequal("wss_proxy",(char *)local_68);
          if (iVar14 == 0) {
            pcVar16 = (char *)0x0;
          }
          else {
            pcVar16 = curl_getenv("https_proxy");
            if (pcVar16 == (char *)0x0) {
              pcVar16 = "HTTPS_PROXY";
              goto LAB_00163205;
            }
          }
        }
        else {
          pcVar16 = "http_proxy";
LAB_00163205:
          pcVar16 = curl_getenv(pcVar16);
        }
        if (pcVar16 == (char *)0x0) {
          pcVar26 = "all_proxy";
          pcVar16 = curl_getenv("all_proxy");
          if (pcVar16 == (char *)0x0) {
            pcVar26 = "ALL_PROXY";
            pcVar16 = curl_getenv("ALL_PROXY");
          }
        }
      }
      if ((((data != (Curl_easy *)0x0) && (pcVar16 != (char *)0x0)) &&
          (((data->set).field_0x897 & 0x40) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,pcVar16);
      }
      goto LAB_00162fea;
    }
    (*Curl_cfree)(pcVar20);
    if (pcVar16 == (char *)0x0) {
LAB_00163022:
      pcVar16 = (char *)0x0;
    }
    else if (conn->unix_domain_socket != (char *)0x0) {
      (*Curl_cfree)(pcVar16);
      goto LAB_00163022;
    }
    if (pcVar16 == (char *)0x0) {
LAB_0016304e:
      pcVar16 = (char *)0x0;
    }
    else if ((*pcVar16 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar16);
      goto LAB_0016304e;
    }
    if (pcVar26 == (char *)0x0) {
LAB_00163079:
      pcVar26 = (char *)0x0;
    }
    else if ((*pcVar26 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar26);
      goto LAB_00163079;
    }
    if (pcVar16 == (char *)0x0 && pcVar26 == (char *)0x0) {
      *(byte *)&conn->bits = *(byte *)&conn->bits & 0xfc;
      pcVar26 = (char *)0x0;
      CVar13 = CURLE_OK;
LAB_0016336a:
      CVar24 = conn->bits;
      uVar15 = 0x10;
      if (((ulong)CVar24 & 1) == 0) {
        uVar15 = (ulong)(CVar24._0_4_ * 8 & 0x10);
      }
      conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffffffef | uVar15);
      if (uVar15 == 0) {
        conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffffffe0);
        (conn->http_proxy).proxytype = '\0';
      }
    }
    else {
      proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
      if (pcVar16 == (char *)0x0) {
LAB_001630b6:
        if (pcVar26 != (char *)0x0) {
          CVar13 = parse_proxy(data,conn,pcVar26,proxytype);
          (*Curl_cfree)(pcVar26);
          if (CVar13 != CURLE_OK) {
            pcVar26 = (char *)0x0;
            goto LAB_001630e6;
          }
        }
        pcVar16 = (conn->http_proxy).host.rawalloc;
        if (pcVar16 == (char *)0x0) {
          CVar24 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
        }
        else {
          if ((conn->handler->protocol & 0xc0000003) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((ulong)conn->bits & 8) != 0)) {
              *(byte *)&conn->bits = *(byte *)&conn->bits | 8;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          CVar24 = (ConnectBits)((ulong)conn->bits | 1);
        }
        conn->bits = CVar24;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
          CVar24 = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffffd);
        }
        else {
          if ((pcVar16 == (char *)0x0) && ((conn->socks_proxy).user == (char *)0x0)) {
            pcVar16 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar16);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          CVar24 = (ConnectBits)((ulong)conn->bits | 2);
        }
        conn->bits = CVar24;
        bVar28 = true;
        pcVar26 = (char *)0x0;
        CVar13 = CURLE_OK;
      }
      else {
        CVar13 = parse_proxy(data,conn,pcVar16,proxytype);
        (*Curl_cfree)(pcVar16);
        if (CVar13 == CURLE_OK) goto LAB_001630b6;
LAB_001630e6:
        bVar28 = false;
      }
      if (bVar28) goto LAB_0016336a;
    }
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (data->state).aptr.proxyuser;
    pcVar26 = (data->state).aptr.proxypasswd;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = "";
    }
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    (conn->http_proxy).user = pcVar16;
    CVar13 = CURLE_OK;
    if (pcVar16 == (char *)0x0) {
LAB_00162e24:
      bVar28 = false;
      CVar13 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar16 = "";
      if (pcVar26 != (char *)0x0) {
        pcVar16 = pcVar26;
      }
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      (conn->http_proxy).passwd = pcVar16;
      bVar28 = true;
      if (pcVar16 == (char *)0x0) {
        (*Curl_cfree)((conn->http_proxy).user);
        (conn->http_proxy).user = (char *)0x0;
        goto LAB_00162e24;
      }
    }
    if (bVar28) goto LAB_00162e34;
LAB_00162f32:
    pcVar16 = (char *)0x0;
    pcVar26 = (char *)0x0;
  }
LAB_001633b6:
  (*Curl_cfree)(pcVar26);
  (*Curl_cfree)(pcVar16);
  protocol_done = local_70;
  asyncp = local_80;
  if (CVar13 != CURLE_OK) goto LAB_00162e7e;
  if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
    conn->bits = (ConnectBits)((ulong)conn->bits | 8);
  }
  uVar5 = (data->set).use_port;
  if ((uVar5 == 0) || (((data->state).field_0x7be & 0x40) == 0)) {
LAB_0016345e:
    CVar13 = CURLE_OK;
    bVar28 = true;
  }
  else {
    conn->remote_port = (uint)uVar5;
    bVar28 = false;
    curl_msnprintf((char *)local_68,0x10,"%d");
    CVar11 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_68,0);
    CVar13 = CURLE_OUT_OF_MEMORY;
    if (CVar11 == CURLUE_OK) goto LAB_0016345e;
  }
  if (((((!bVar28) || (CVar13 = override_login(data,conn), CVar13 != CURLE_OK)) ||
       (CVar13 = set_login(data,conn), CVar13 != CURLE_OK)) ||
      ((CVar13 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar13 != CURLE_OK ||
       ((((ulong)conn->bits & 1) != 0 &&
        (CVar13 = Curl_idnconvert_hostname(&(conn->http_proxy).host), CVar13 != CURLE_OK)))))) ||
     (((((ulong)conn->bits & 2) != 0 &&
       (CVar13 = Curl_idnconvert_hostname(&(conn->socks_proxy).host), CVar13 != CURLE_OK)) ||
      ((((conn->bits).field_0x1 & 1) != 0 &&
       (CVar13 = Curl_idnconvert_hostname(&conn->conn_to_host), CVar13 != CURLE_OK))))))
  goto LAB_00162e7e;
  if ((((conn->bits).field_0x1 & 1) != 0) &&
     (iVar14 = curl_strequal((conn->conn_to_host).name,(conn->host).name), iVar14 != 0)) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfe;
  }
  if (((SUB84(conn->bits,0) >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
    conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffdff);
  }
  CVar24 = conn->bits;
  if (((ulong)CVar24 & 1) != 0 && ((ulong)CVar24 & 0x300) != 0) {
    conn->bits = (ConnectBits)((ulong)CVar24 | 8);
  }
  CVar13 = setup_connection_internals(data,conn);
  if (CVar13 != CURLE_OK) goto LAB_00162e7e;
  pCVar6 = conn->handler;
  if ((pCVar6->flags & 0x10) != 0) {
    (data->info).conn_scheme = pCVar6->scheme;
    (data->info).conn_protocol = pCVar6->protocol & 0x3ffffff;
    CVar13 = (*pCVar6->connect_it)(data,(_Bool *)local_68);
    if (CVar13 == CURLE_OK) {
      Curl_attach_connection(data,conn);
      CVar13 = Curl_cpool_add(data,conn);
      if (CVar13 == CURLE_OK) {
        CVar13 = setup_range(data);
      }
      if (CVar13 != CURLE_OK) {
        (*conn->handler->done)(data,CVar13,false);
        asyncp = local_80;
        protocol_done = local_70;
        goto LAB_00162e7e;
      }
      Curl_xfer_setup_nop(data);
      CVar13 = CURLE_OK;
    }
    Curl_init_do(data,conn);
    asyncp = local_80;
    protocol_done = local_70;
    goto LAB_00162e7e;
  }
  conn->recv[0] = Curl_cf_recv;
  conn->send[0] = Curl_cf_send;
  conn->recv[1] = Curl_cf_recv;
  conn->send[1] = Curl_cf_send;
  conn->bits = (ConnectBits)
               ((ulong)conn->bits & 0xffffffffff7fffff |
               (ulong)((uint)(*(ulong *)&(data->set).field_0x894 >> 0x12) & 0x800000));
  CVar13 = Curl_ssl_easy_config_complete(data);
  asyncp = local_80;
  protocol_done = local_70;
  if (CVar13 != CURLE_OK) goto LAB_00162e7e;
  Curl_cpool_prune_dead(data);
  uVar15 = *(ulong *)&(data->set).field_0x894;
  if ((uVar15 >> 0x20 & 1) == 0) {
    if ((uVar15 & 1) != 0) goto LAB_0016378a;
LAB_00163734:
    _Var9 = ConnectionExists(data,conn,&local_40,&local_71,&local_81);
    if (!_Var9) goto LAB_0016378a;
    if ((conn->given->flags & 1) == 0) {
      _Var9 = Curl_conn_is_ssl(conn,0);
      pcVar16 = "";
      if (_Var9) {
        pcVar16 = " (upgraded to SSL)";
      }
    }
    else {
      pcVar16 = "";
    }
    conn_00 = local_40;
    reuse_conn(data,conn,local_40);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      pcVar26 = "proxy";
      if (((ulong)conn_00->bits & 0x10) == 0) {
        pcVar26 = "host";
      }
      lVar21 = 0xd8;
      if (((conn_00->socks_proxy).host.name == (char *)0x0) &&
         (lVar21 = 0x110, (conn_00->http_proxy).host.name == (char *)0x0)) {
        lVar21 = 0x88;
      }
      Curl_infof(data,"Re-using existing %s: connection%s with %s %s",conn_00->given->scheme,pcVar16
                 ,pcVar26,*(undefined8 *)((long)&(conn_00->cpool_node)._list + lVar21));
    }
LAB_00163a66:
    Curl_init_do(data,conn_00);
    CVar13 = setup_range(data);
    asyncp = local_80;
    protocol_done = local_70;
    if (CVar13 == CURLE_OK) {
      if (((ulong)conn_00->bits & 0x40) == 0) {
        CVar13 = resolve_server(data,conn_00,local_80);
        asyncp = local_80;
        protocol_done = local_70;
        if (CVar13 != CURLE_OK) goto LAB_00162e7e;
      }
      else {
        *local_80 = false;
      }
      pCVar6 = conn_00->handler;
      (data->info).conn_scheme = pCVar6->scheme;
      (data->info).conn_protocol = pCVar6->protocol & 0x3ffffff;
      (data->info).field_0xf4 = (data->info).field_0xf4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
      CVar13 = Curl_conn_ev_data_setup(data);
      asyncp = local_80;
      protocol_done = local_70;
    }
  }
  else {
    if (((uVar15 & 1) == 0) && ((data->state).followlocation != 0)) goto LAB_00163734;
LAB_0016378a:
    if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x899 & 4) != 0)) {
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 1;
    }
    if (local_81 == true) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        pcVar16 = "Waiting on connection to negotiate possible multiplexing.";
LAB_0016382d:
        Curl_infof(data,pcVar16);
      }
    }
    else {
      iVar14 = Curl_cpool_check_limits(data,conn);
      if (iVar14 == 2) {
        if (-1 < (data->set).dohfor_mid) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
              (0 < pcVar7->log_level)))) {
            Curl_infof(data,"Allowing DoH to override max connection limit");
          }
          goto LAB_001638df;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"No connections available, total of %ld reached.",
                     data->multi->max_total_connections);
        }
      }
      else {
        if (iVar14 != 1) {
LAB_001638df:
          CVar13 = Curl_ssl_conn_config_init(data,conn);
          asyncp = local_80;
          protocol_done = local_70;
          if (CVar13 != CURLE_OK) goto LAB_00162e7e;
          Curl_attach_connection(data,conn);
          CVar13 = Curl_cpool_add(data,conn);
          asyncp = local_80;
          protocol_done = local_70;
          if (CVar13 != CURLE_OK) goto LAB_00162e7e;
          if ((((data->state).authhost.picked & 8) != 0) &&
             (((data->state).authhost.field_0x18 & 1) != 0)) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"NTLM picked AND auth done set, clear picked");
            }
            (data->state).authhost.picked = 0;
            puVar1 = &(data->state).authhost.field_0x18;
            *puVar1 = *puVar1 & 0xfe;
          }
          if ((((data->state).authproxy.picked & 8) != 0) &&
             (((data->state).authproxy.field_0x18 & 1) != 0)) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
            }
            (data->state).authproxy.picked = 0;
            puVar1 = &(data->state).authproxy.field_0x18;
            *puVar1 = *puVar1 & 0xfe;
          }
          goto LAB_00163a66;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          pcVar16 = "No more connections allowed to host";
          goto LAB_0016382d;
        }
      }
    }
    Curl_conn_free(data,conn);
    CVar13 = CURLE_NO_CONNECTION_AVAILABLE;
    conn_00 = (connectdata *)0x0;
    asyncp = local_80;
    protocol_done = local_70;
  }
LAB_00162e7e:
  if (CVar13 == CURLE_OK) {
    sVar17 = Curl_llist_count(&conn_00->easyq);
    if (sVar17 < 2) {
      CVar13 = CURLE_OK;
      if (*asyncp == false) {
        CVar13 = Curl_setup_conn(data,protocol_done);
      }
    }
    else {
      *protocol_done = true;
      CVar13 = CURLE_OK;
    }
  }
  if (((CVar13 != CURLE_NO_CONNECTION_AVAILABLE) && (conn_00 != (connectdata *)0x0)) &&
     (CVar13 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conn_terminate(data,conn_00,true);
  }
  return CVar13;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}